

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

IfcVector3 *
Assimp::IFC::TempMesh::ComputePolygonNormal
          (IfcVector3 *__return_storage_ptr__,IfcVector3 *vtcs,size_t cnt,bool normalize)

{
  double dVar1;
  long lVar2;
  aiVector3t<double> *out;
  size_t sVar3;
  bool bVar4;
  vector<double,_std::allocator<double>_> temp;
  IfcVector3 nor;
  _Vector_base<double,_std::allocator<double>_> local_50;
  aiVector3t<double> local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_50,cnt * 3 + 6,
             (allocator_type *)&local_38);
  lVar2 = 0;
  sVar3 = cnt;
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    *(undefined8 *)((long)local_50._M_impl.super__Vector_impl_data._M_start + lVar2) =
         *(undefined8 *)((long)&vtcs->x + lVar2);
    *(undefined8 *)((long)local_50._M_impl.super__Vector_impl_data._M_start + lVar2 + 8) =
         *(undefined8 *)((long)&vtcs->y + lVar2);
    *(undefined8 *)((long)local_50._M_impl.super__Vector_impl_data._M_start + lVar2 + 0x10) =
         *(undefined8 *)((long)&vtcs->z + lVar2);
    lVar2 = lVar2 + 0x18;
  }
  out = &local_38;
  local_38.z = 0.0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  NewellNormal<3,3,3,double>
            (out,(int)cnt,local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_start + 1,
             local_50._M_impl.super__Vector_impl_data._M_start + 2);
  if (normalize) {
    out = aiVector3t<double>::Normalize(&local_38);
  }
  __return_storage_ptr__->z = out->z;
  dVar1 = out->y;
  __return_storage_ptr__->x = out->x;
  __return_storage_ptr__->y = dVar1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 TempMesh::ComputePolygonNormal(const IfcVector3* vtcs, size_t cnt, bool normalize)
{
    std::vector<IfcFloat> temp((cnt+2)*3);
    for( size_t vofs = 0, i = 0; vofs < cnt; ++vofs )
    {
        const IfcVector3& v = vtcs[vofs];
        temp[i++] = v.x;
        temp[i++] = v.y;
        temp[i++] = v.z;
    }

    IfcVector3 nor;
    NewellNormal<3, 3, 3>(nor, static_cast<int>(cnt), &temp[0], &temp[1], &temp[2]);
    return normalize ? nor.Normalize() : nor;
}